

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interpreter.cpp
# Opt level: O0

wstring * __thiscall
mjs::interpreter::impl::stack_trace_abi_cxx11_(wstring *__return_storage_ptr__,impl *this)

{
  bool bVar1;
  pointer this_00;
  wostream *os;
  reference extend;
  undefined1 local_1b0 [8];
  const_reverse_iterator end;
  const_reverse_iterator it;
  wostringstream local_190 [8];
  wostringstream woss;
  impl *this_local;
  
  std::__cxx11::wostringstream::wostringstream(local_190);
  bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)&this->current_extend_);
  if (!bVar1) {
    __assert_fail("current_extend_.file",
                  "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/src/mjs/interpreter.cpp"
                  ,0x525,"std::wstring mjs::interpreter::impl::stack_trace() const");
  }
  mjs::operator<<((basic_ostream<wchar_t,_std::char_traits<wchar_t>_> *)local_190,
                  &this->current_extend_);
  std::vector<mjs::source_extend,_std::allocator<mjs::source_extend>_>::crbegin
            ((vector<mjs::source_extend,_std::allocator<mjs::source_extend>_> *)&end);
  std::vector<mjs::source_extend,_std::allocator<mjs::source_extend>_>::crend
            ((vector<mjs::source_extend,_std::allocator<mjs::source_extend>_> *)local_1b0);
  while( true ) {
    bVar1 = std::operator!=(&end,(reverse_iterator<__gnu_cxx::__normal_iterator<const_mjs::source_extend_*,_std::vector<mjs::source_extend,_std::allocator<mjs::source_extend>_>_>_>
                                  *)local_1b0);
    if (!bVar1) {
      std::__cxx11::wostringstream::str();
      std::__cxx11::wostringstream::~wostringstream(local_190);
      return __return_storage_ptr__;
    }
    this_00 = std::
              reverse_iterator<__gnu_cxx::__normal_iterator<const_mjs::source_extend_*,_std::vector<mjs::source_extend,_std::allocator<mjs::source_extend>_>_>_>
              ::operator->(&end);
    bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)this_00);
    if (!bVar1) break;
    os = std::operator<<((wostream *)local_190,"\n");
    extend = std::
             reverse_iterator<__gnu_cxx::__normal_iterator<const_mjs::source_extend_*,_std::vector<mjs::source_extend,_std::allocator<mjs::source_extend>_>_>_>
             ::operator*(&end);
    mjs::operator<<(os,extend);
    std::
    reverse_iterator<__gnu_cxx::__normal_iterator<const_mjs::source_extend_*,_std::vector<mjs::source_extend,_std::allocator<mjs::source_extend>_>_>_>
    ::operator++(&end);
  }
  __assert_fail("it->file",
                "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/src/mjs/interpreter.cpp"
                ,0x528,"std::wstring mjs::interpreter::impl::stack_trace() const");
}

Assistant:

std::wstring stack_trace() const {
        std::wostringstream woss;
        assert(current_extend_.file);
        woss << current_extend_;
        for (auto it =  stack_trace_.crbegin(), end = stack_trace_.crend(); it != end; ++it) {
            assert(it->file);
            woss << "\n" << *it;
        }
        return woss.str();
    }